

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  ImVec2 IVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  float *pfVar12;
  char *text;
  float scale;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  float fVar18;
  uint c;
  uint local_70;
  float local_6c;
  float local_68;
  float fStack_64;
  uint uStack_60;
  float fStack_5c;
  char **local_50;
  float local_48;
  float fStack_44;
  uint uStack_40;
  float fStack_3c;
  
  local_6c = max_width;
  local_50 = remaining;
  if (text_end == (char *)0x0) {
    sVar10 = strlen(text_begin);
    text_end = text_begin + sVar10;
  }
  scale = size / this->FontSize;
  pcVar11 = (char *)0x0;
  fVar15 = 0.0;
  fVar16 = 0.0;
  uVar17 = 0;
  fVar18 = 0.0;
  fVar14 = 0.0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  uVar7 = 0;
  fVar8 = 0.0;
LAB_0017cdff:
  do {
    fStack_3c = fVar8;
    uStack_40 = uVar7;
    fStack_44 = fVar6;
    local_48 = fVar5;
    fStack_5c = (float)uVar4;
    uStack_60 = uVar3;
    fStack_64 = (float)uVar2;
    local_68 = fVar14;
    text = text_begin;
    fVar13 = fVar16;
    if (text_end <= text) goto LAB_0017cf6d;
    if (0.0 < wrap_width) {
      if (pcVar11 == (char *)0x0) {
        pcVar11 = CalcWordWrapPositionA(this,scale,text,text_end,wrap_width - local_68);
        fVar15 = local_48;
        fVar16 = fStack_44;
        uVar17 = uStack_40;
        fVar18 = fStack_3c;
      }
      if (pcVar11 <= text) {
        if (fVar15 < local_68) {
          fVar15 = local_68;
        }
        fStack_64 = fVar16 + size;
        local_68 = fVar15;
        uStack_60 = uVar17;
        fStack_5c = fVar18;
        text_begin = CalcWordWrapNextLineStartA(text,text_end);
        pcVar11 = (char *)0x0;
        fVar15 = local_68;
        fVar16 = fStack_64;
        uVar17 = uStack_60;
        fVar18 = fStack_5c;
        fVar14 = 0.0;
        uVar2 = 0;
        uVar3 = 0;
        uVar4 = 0;
        fVar5 = local_68;
        fVar6 = fStack_64;
        uVar7 = uStack_60;
        fVar8 = fStack_5c;
        goto LAB_0017cdff;
      }
    }
    local_70 = (uint)*text;
    if (*text < '\0') {
      iVar9 = ImTextCharFromUtf8(&local_70,text,text_end);
      text_begin = text + iVar9;
      fVar15 = local_48;
      fVar13 = fStack_44;
      uVar17 = uStack_40;
      fVar18 = fStack_3c;
    }
    else {
      text_begin = text + 1;
      fVar13 = fVar16;
    }
    fVar16 = fVar13;
    if (local_70 < 0x20) {
      fVar14 = local_68;
      uVar2 = (uint)fStack_64;
      uVar3 = uStack_60;
      uVar4 = fStack_5c;
      fVar5 = fVar15;
      fVar6 = fVar13;
      uVar7 = uVar17;
      fVar8 = fVar18;
      if (local_70 == 0xd) goto LAB_0017cdff;
      if (local_70 == 10) {
        fVar15 = (float)(~-(uint)(local_68 <= fVar15) & (uint)local_68 |
                        -(uint)(local_68 <= fVar15) & (uint)fVar15);
        fVar16 = fVar13 + size;
        uVar17 = (uint)fStack_64 & (uint)fVar13;
        fVar18 = fVar13;
        fVar14 = 0.0;
        uVar2 = 0;
        uVar3 = 0;
        uVar4 = 0;
        fVar5 = fVar15;
        fVar6 = fVar13 + size;
        uVar7 = (uint)fStack_64 & (uint)fVar13;
        fVar8 = fVar13;
        goto LAB_0017cdff;
      }
    }
    pfVar12 = (this->IndexAdvanceX).Data + local_70;
    if ((this->IndexAdvanceX).Size <= (int)local_70) {
      pfVar12 = &this->FallbackAdvanceX;
    }
    fVar14 = *pfVar12 * scale + local_68;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    fVar5 = local_48;
    fVar6 = fStack_44;
    uVar7 = uStack_40;
    fVar8 = fStack_3c;
    if (local_6c <= fVar14) {
LAB_0017cf6d:
      if (local_50 != (char **)0x0) {
        *local_50 = text;
      }
      if (fVar15 < local_68) {
        fVar15 = local_68;
      }
      if (fVar13 == 0.0 || 0.0 < local_68) {
        fVar13 = fVar13 + size;
      }
      IVar1.y = fVar13;
      IVar1.x = fVar15;
      return IVar1;
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
            s += 1;
        else
            s += ImTextCharFromUtf8(&c, s, text_end);

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}